

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::emit_vertex
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  NegativeTestContext *pNVar1;
  bool bVar2;
  char *__s;
  ShaderFunction in_R8D;
  string local_d0;
  undefined1 local_b0 [8];
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  int local_48;
  int shaderNdx;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"EmitVertex.",&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  for (local_48 = 0; local_48 < 6; local_48 = local_48 + 1) {
    bVar2 = NegativeTestContext::isShaderSupported
                      (local_10,*(ShaderType *)
                                 (NegativeTestShared::(anonymous_namespace)::s_shaders +
                                 (long)local_48 * 4));
    pNVar1 = local_10;
    if ((bVar2) &&
       (*(int *)(NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4) != 2)) {
      __s = glu::getShaderTypeName
                      (*(ShaderType *)
                        (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4))
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,__s,
                 (allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
      std::operator+(&local_68,"Verify shader: ",&local_88);
      NegativeTestContext::beginSection(pNVar1,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf))
      ;
      NegativeTestShared::(anonymous_namespace)::genShaderSourceGeometry_abi_cxx11_
                ((string *)local_b0,(_anonymous_namespace_ *)local_10,
                 (NegativeTestContext *)
                 (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                 (long)local_48 * 4),0xe,in_R8D);
      pNVar1 = local_10;
      shaderType = *(ShaderType *)
                    (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_48 * 4);
      std::__cxx11::string::string((string *)&local_d0,(string *)local_b0);
      verifyShader(pNVar1,shaderType,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      NegativeTestContext::endSection(local_10);
      std::__cxx11::string::~string((string *)local_b0);
    }
  }
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void emit_vertex (NegativeTestContext& ctx)
{
	ctx.beginSection("EmitVertex.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			if (s_shaders[shaderNdx] == glu::SHADERTYPE_GEOMETRY)
				continue;

			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			const std::string shaderSource =	genShaderSourceGeometry(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_EMIT_VERTEX);
			verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			ctx.endSection();
		}
	}
	ctx.endSection();
}